

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

short * __thiscall
cubeb_resampler_speex_one_way<short>::output
          (cubeb_resampler_speex_one_way<short> *this,size_t output_frame_count,
          size_t *input_frames_used)

{
  size_t sVar1;
  size_t sVar2;
  auto_array<short> *paVar3;
  cubeb_resampler_speex_one_way<short> *this_00;
  short *psVar4;
  uint32_t *puVar5;
  ulong *in_RDX;
  size_t in_RSI;
  long in_RDI;
  uint32_t i;
  short *data;
  uint32_t out_len;
  uint32_t in_len;
  short *in_stack_ffffffffffffff98;
  uint32_t *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb0;
  uint local_2c;
  
  sVar1 = auto_array<short>::capacity((auto_array<short> *)(in_RDI + 0x38));
  sVar2 = processor::frames_to_samples((processor *)(in_RDI + 8),in_RSI);
  if (sVar1 < sVar2) {
    paVar3 = (auto_array<short> *)(in_RDI + 0x38);
    processor::frames_to_samples((processor *)(in_RDI + 8),in_RSI);
    auto_array<short>::reserve(paVar3,in_stack_ffffffffffffffb0);
  }
  paVar3 = (auto_array<short> *)(in_RDI + 8);
  sVar1 = auto_array<short>::length((auto_array<short> *)(in_RDI + 0x20));
  sVar1 = processor::samples_to_frames((processor *)paVar3,sVar1);
  this_00 = (cubeb_resampler_speex_one_way<short> *)
            auto_array<short>::data((auto_array<short> *)(in_RDI + 0x20));
  auto_array<short>::data((auto_array<short> *)(in_RDI + 0x38));
  speex_resample(this_00,(short *)paVar3,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (uint32_t *)0x149b58);
  if ((in_RSI & 0xffffffff) < in_RSI) {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (1 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: underrun during resampling: got %u frames, expected %zu\n",
                 "cubeb_resampler_internal.h",0x105,in_RSI & 0xffffffff,in_RSI);
    }
    psVar4 = auto_array<short>::data((auto_array<short> *)(in_RDI + 0x38));
    sVar2 = processor::frames_to_samples((processor *)(in_RDI + 8),in_RSI & 0xffffffff);
    local_2c = (uint)sVar2;
    while( true ) {
      in_stack_ffffffffffffffa0 = (uint32_t *)(ulong)local_2c;
      puVar5 = (uint32_t *)processor::frames_to_samples((processor *)(in_RDI + 8),in_RSI);
      if (puVar5 <= in_stack_ffffffffffffffa0) break;
      psVar4[local_2c] = 0;
      local_2c = local_2c + 1;
    }
  }
  sVar2 = in_RDI + 0x20;
  processor::frames_to_samples((processor *)(in_RDI + 8),sVar1 & 0xffffffff);
  auto_array<short>::pop(paVar3,(short *)in_stack_ffffffffffffffa0,sVar2);
  *in_RDX = sVar1 & 0xffffffff;
  psVar4 = auto_array<short>::data((auto_array<short> *)(in_RDI + 0x38));
  return psVar4;
}

Assistant:

T * output(size_t output_frame_count, size_t * input_frames_used)
  {
    if (resampling_out_buffer.capacity() < frames_to_samples(output_frame_count)) {
      resampling_out_buffer.reserve(frames_to_samples(output_frame_count));
    }

    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len,
                   resampling_out_buffer.data(), &out_len);

    if (out_len < output_frame_count) {
      LOGV("underrun during resampling: got %u frames, expected %zu", (unsigned)out_len, output_frame_count);
      // silence the rightmost part
      T* data = resampling_out_buffer.data();
      for (uint32_t i = frames_to_samples(out_len); i < frames_to_samples(output_frame_count); i++) {
        data[i] = 0;
      }
    }

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));
    *input_frames_used = in_len;

    return resampling_out_buffer.data();
  }